

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O2

iterator * __thiscall
diy::
concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
::begin(iterator *__return_storage_ptr__,
       concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
       *this)

{
  shared_ptr<std::unique_lock<tthread::fast_mutex>_> p;
  __shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::make_shared<std::unique_lock<tthread::fast_mutex>,tthread::fast_mutex&>
            ((fast_mutex *)&_Stack_28);
  (__return_storage_ptr__->it)._M_node =
       (this->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(__return_storage_ptr__->lock_ptr).
              super___shared_ptr<std::unique_lock<tthread::fast_mutex>,_(__gnu_cxx::_Lock_policy)2>,
             &_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

iterator        begin()                 { auto p = std::make_shared<lock_guard<fast_mutex>>(mutex_); return iterator(map_.begin(), p); }